

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O1

bool __thiscall
cmFindPackageCommand::FindConfigFile(cmFindPackageCommand *this,string *dir,string *file)

{
  pointer pbVar1;
  bool bVar2;
  const_iterator cVar3;
  pointer pbVar4;
  bool bVar5;
  string local_50;
  
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&(this->IgnoredPaths)._M_t,dir);
  if ((_Rb_tree_header *)cVar3._M_node == &(this->IgnoredPaths)._M_t._M_impl.super__Rb_tree_header)
  {
    pbVar1 = (this->Configs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar4 = (this->Configs).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; bVar5 = pbVar4 != pbVar1, bVar5;
        pbVar4 = pbVar4 + 1) {
      std::__cxx11::string::_M_assign((string *)file);
      std::__cxx11::string::append((char *)file);
      std::__cxx11::string::_M_append((char *)file,(ulong)(pbVar4->_M_dataplus)._M_p);
      if (this->DebugMode == true) {
        FindConfigFile((cmFindPackageCommand *)file);
      }
      bVar2 = cmsys::SystemTools::FileExists(file,true);
      if ((bVar2) && (bVar2 = CheckVersion(this,file), bVar2)) {
        if (this->UseRealPath != true) {
          return bVar5;
        }
        cmsys::SystemTools::GetRealPath(&local_50,file,(string *)0x0);
        std::__cxx11::string::operator=((string *)file,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p == &local_50.field_2) {
          return bVar5;
        }
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        return bVar5;
      }
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool cmFindPackageCommand::FindConfigFile(std::string const& dir,
                                          std::string& file)
{
  if (this->IgnoredPaths.count(dir)) {
    return false;
  }

  for (std::string const& c : this->Configs) {
    file = dir;
    file += "/";
    file += c;
    if (this->DebugMode) {
      fprintf(stderr, "Checking file [%s]\n", file.c_str());
    }
    if (cmSystemTools::FileExists(file, true) && this->CheckVersion(file)) {
      // Allow resolving symlinks when the config file is found through a link
      if (this->UseRealPath) {
        file = cmSystemTools::GetRealPath(file);
      }
      return true;
    }
  }
  return false;
}